

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicates
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,
          nodeset_eval_t eval)

{
  xpath_ast_node *this_00;
  bool bVar1;
  
  if ((long)ns->_end - (long)ns->_begin >> 4 != first) {
    this_00 = this->_right;
    bVar1 = eval == nodeset_eval_any;
    if (ns->_type == type_sorted) {
      bVar1 = eval != nodeset_eval_all;
    }
    for (; this_00 != (xpath_ast_node *)0x0; this_00 = this_00->_next) {
      apply_predicate(this_00,ns,first,stack,(bool)(this_00->_next == (xpath_ast_node *)0x0 & bVar1)
                     );
    }
  }
  return;
}

Assistant:

void apply_predicates(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, nodeset_eval_t eval)
		{
			if (ns.size() == first) return;

			bool last_once = eval_once(ns.type(), eval);

			for (xpath_ast_node* pred = _right; pred; pred = pred->_next)
				pred->apply_predicate(ns, first, stack, !pred->_next && last_once);
		}